

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzDoubleMod(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  ulong in_RCX;
  word *in_RDX;
  long in_RSI;
  word *in_RDI;
  size_t i;
  word mask;
  word hi;
  word carry;
  ulong local_40;
  ulong local_38;
  ulong local_28;
  
  local_28 = 0;
  local_38 = 1;
  for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
    uVar1 = *(ulong *)(in_RSI + local_40 * 8);
    in_RDI[local_40] = *(long *)(in_RSI + local_40 * 8) << 1 | local_28;
    local_38 = (long)(int)(uint)(in_RDX[local_40] < in_RDI[local_40]) |
               (long)(int)(uint)(in_RDX[local_40] == in_RDI[local_40]) & local_38;
    local_28 = uVar1 >> 0x3f;
  }
  zzSubAndW(in_RDI,in_RDX,in_RCX,-(local_28 | local_38));
  return;
}

Assistant:

void SAFE(zzDoubleMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word hi;
	register word mask = 1;
	size_t i;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	// b <- a * 2
	for (i = 0; i < n; ++i)
	{
		hi = a[i] >> (B_PER_W - 1);
		b[i] = a[i] << 1 | carry;
		carry = hi;
		// mask <- mod[i] < b[i] || mask && mod[i] == b[i];
		mask &= wordEq01(mod[i], b[i]);
		mask |= wordLess01(mod[i], b[i]);
	}
	// sub mod
	mask |= carry;
	mask = WORD_0 - mask;
	zzSubAndW(b, mod, n, mask);
	// очистка
	hi = carry = mask = 0;
}